

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_example_json.h
# Opt level: O1

BaseState<true> * __thiscall
DefaultState<true>::Ignore(DefaultState<true> *this,Context<true> *ctx,SizeType length)

{
  byte *pbVar1;
  byte bVar2;
  Ch *pCVar3;
  ulong uVar4;
  bool bVar5;
  byte *pbVar6;
  stringstream *psVar7;
  long lVar8;
  int iVar9;
  bool bVar10;
  char *pcVar11;
  int iVar12;
  char local_39;
  ulong local_38;
  
  pCVar3 = ctx->stream->src_;
  uVar4 = (ulong)length;
  pcVar11 = pCVar3 + uVar4 + 2;
  if ((pcVar11 < ctx->stream_end) && (*pcVar11 == ':')) {
    pbVar6 = (byte *)(pCVar3 + uVar4 + 3);
    bVar10 = false;
    iVar12 = 0;
    iVar9 = 0;
    local_38 = uVar4;
    do {
      bVar2 = *pbVar6;
      if (bVar2 < 0x5d) {
        if (bVar2 < 0x2c) {
          if (bVar2 == 0x22) {
            bVar5 = false;
            do {
              pbVar1 = pbVar6 + 1;
              bVar2 = pbVar6[1];
              if (bVar2 == 0x22) {
                bVar5 = true;
                pbVar6 = pbVar1;
              }
              else if (bVar2 == 0x5c) {
                pbVar6 = pbVar6 + 2;
              }
              else {
                pbVar6 = pbVar1;
                if (bVar2 == 0) {
                  psVar7 = Context<true>::error_abi_cxx11_(ctx);
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)(psVar7 + 0x10),"Found EOF",9);
                  break;
                }
              }
            } while (!bVar5);
            if (!bVar5) {
              return (BaseState<true> *)0x0;
            }
          }
          else if (bVar2 == 0) goto LAB_001e6776;
        }
        else if (bVar2 == 0x2c) {
          if (iVar9 == 0 && iVar12 == 0) goto LAB_001e667f;
        }
        else if (bVar2 == 0x5b) {
          iVar12 = iVar12 + 1;
        }
      }
      else if (bVar2 == 0x5d) {
        if (iVar9 == 0 && iVar12 == 0) {
LAB_001e667f:
          bVar10 = true;
          iVar9 = 0;
          iVar12 = 0;
        }
        else {
          iVar12 = iVar12 + -1;
        }
      }
      else if (bVar2 == 0x7b) {
        iVar9 = iVar9 + 1;
      }
      else if (bVar2 == 0x7d) {
        if (iVar9 == 0 && iVar12 == 0) goto LAB_001e667f;
        iVar9 = iVar9 + -1;
      }
      pbVar6 = pbVar6 + 1;
    } while (!bVar10);
    pCVar3 = ctx->stream->src_;
    if (pCVar3 + local_38 + 3 < ctx->stream_end) {
      pCVar3[local_38 + 3] = '0';
      memset(pCVar3 + local_38 + 4,0x20,(size_t)(pbVar6 + ~(ulong)(pCVar3 + local_38 + 4)));
      return &(ctx->ignore_state).super_BaseState<true>;
    }
LAB_001e6776:
    psVar7 = Context<true>::error_abi_cxx11_(ctx);
    psVar7 = psVar7 + 0x10;
    pcVar11 = "Found EOF";
    lVar8 = 9;
  }
  else {
    psVar7 = Context<true>::error_abi_cxx11_(ctx);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)(psVar7 + 0x10),"Expected \':\' found \'",0x14);
    local_39 = *pcVar11;
    psVar7 = (stringstream *)
             std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)(psVar7 + 0x10),&local_39,1);
    pcVar11 = "\'";
    lVar8 = 1;
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)psVar7,pcVar11,lVar8);
  return (BaseState<true> *)0x0;
}

Assistant:

BaseState<audit>* Ignore(Context<audit>& ctx, rapidjson::SizeType length)
  {
    // fast ignore
    // skip key + \0 + "
    char* head = ctx.stream->src_ + length + 2;
    if (head >= ctx.stream_end || *head != ':')
    {
      ctx.error() << "Expected ':' found '" << *head << "'";
      return nullptr;
    }
    head++;

    // scan for ,}
    // support { { ... } }
    int depth = 0, sq_depth = 0;
    bool stop = false;
    while (!stop)
    {
      switch (*head)
      {
        case '\0':
          ctx.error() << "Found EOF";
          return nullptr;
        case '"':
        {
          // skip strings
          bool stopInner = false;
          while (!stopInner)
          {
            head++;
            switch (*head)
            {
              case '\0':
                ctx.error() << "Found EOF";
                return nullptr;
              case '\\':
                head++;
                break;
              case '"':
                stopInner = true;
                break;
            }
          }
          break;
        }
        case '{':
          depth++;
          break;
        case '}':
          if (depth == 0 && sq_depth == 0)
            stop = true;
          else
            depth--;
          break;
        case '[':
          sq_depth++;
          break;
        case ']':
          if (depth == 0 && sq_depth == 0)
            stop = true;
          else
            sq_depth--;
          break;
        case ',':
          if (depth == 0 && sq_depth == 0)
            stop = true;
          break;
      }
      head++;
    }

    // skip key + \0 + ":
    char* value = ctx.stream->src_ + length + 3;
    if (value >= ctx.stream_end)
    {
      ctx.error() << "Found EOF";
      return nullptr;
    }

    *value = '0';
    value++;
    memset(value, ' ', head - value - 1);

    return &ctx.ignore_state;
  }